

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMessagePattern::BacktraceParams>::copyAppend
          (QGenericArrayOps<QMessagePattern::BacktraceParams> *this,BacktraceParams *b,
          BacktraceParams *e)

{
  BacktraceParams *pBVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size;
    do {
      pDVar2 = (b->backtraceSeparator).d.d;
      pBVar1[lVar4].backtraceSeparator.d.d = pDVar2;
      pBVar1[lVar4].backtraceSeparator.d.ptr = (b->backtraceSeparator).d.ptr;
      pBVar1[lVar4].backtraceSeparator.d.size = (b->backtraceSeparator).d.size;
      lVar3 = lVar4;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size;
      }
      pBVar1[lVar4].backtraceDepth = b->backtraceDepth;
      b = b + 1;
      lVar4 = lVar3 + 1;
      (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }